

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_yuv_rgb.c
# Opt level: O0

void convert_rgb_to_rgba(uint8_t *RGB,uint32_t width,uint32_t height,uint8_t **RGBA)

{
  uint8_t *puVar1;
  uint local_28;
  uint local_24;
  uint32_t x;
  uint32_t y;
  uint8_t **RGBA_local;
  uint32_t height_local;
  uint32_t width_local;
  uint8_t *RGB_local;
  
  puVar1 = (uint8_t *)malloc((ulong)(width * 4 * height));
  *RGBA = puVar1;
  for (local_24 = 0; local_24 < height; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < width; local_28 = local_28 + 1) {
      (*RGBA)[(local_24 * width + local_28) * 4] = RGB[(local_24 * width + local_28) * 3];
      (*RGBA)[(local_24 * width + local_28) * 4 + 1] = RGB[(local_24 * width + local_28) * 3 + 1];
      (*RGBA)[(local_24 * width + local_28) * 4 + 2] = RGB[(local_24 * width + local_28) * 3 + 2];
      (*RGBA)[(local_24 * width + local_28) * 4 + 3] = '\0';
    }
  }
  return;
}

Assistant:

void convert_rgb_to_rgba(const uint8_t *RGB, uint32_t width, uint32_t height, uint8_t **RGBA)
{
	*RGBA = malloc(4*width*height);
	for(uint32_t y=0; y<height; ++y)
	{
		for(uint32_t x=0; x<width; ++x)
		{
			(*RGBA)[(y*width+x)*4] = RGB[(y*width+x)*3];
			(*RGBA)[(y*width+x)*4+1] = RGB[(y*width+x)*3+1];
			(*RGBA)[(y*width+x)*4+2] = RGB[(y*width+x)*3+2];
			(*RGBA)[(y*width+x)*4+3] = 0;
		}
	}
}